

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void Js::InterpreterStackFrame::TraceOpCode(InterpreterStackFrame *that,OpCode op)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  char16 *pcVar5;
  undefined6 in_register_00000032;
  
  piVar1 = (int *)(*(long *)(that + 0x78) + 0xb38 +
                  (CONCAT62(in_register_00000032,op) & 0xffffffff) * 4);
  *piVar1 = *piVar1 + 1;
  uVar3 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  LVar4 = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(that + 0x88));
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,InterpreterPhase,uVar3,LVar4);
  if (bVar2) {
    uVar3 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
    LVar4 = FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)(that + 0x88));
    pcVar5 = OpCodeUtil::GetOpCodeName(op);
    Output::Print(L"%d.%d:Executing %s at offset 0x%X\n",(ulong)uVar3,(ulong)LVar4,pcVar5,
                  *(undefined8 *)(that + 0x108));
    return;
  }
  return;
}

Assistant:

void InterpreterStackFrame::TraceOpCode(InterpreterStackFrame* that, Js::OpCode op)
    {
#if DBG_DUMP
        that->scriptContext->byteCodeHistogram[(int)op]++;
        if (PHASE_TRACE(Js::InterpreterPhase, that->m_functionBody))
        {
            Output::Print(_u("%d.%d:Executing %s at offset 0x%X\n"), that->m_functionBody->GetSourceContextId(), that->m_functionBody->GetLocalFunctionId(), Js::OpCodeUtil::GetOpCodeName(op), that->DEBUG_currentByteOffset);
        }
#endif
    }